

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gillespie.cpp
# Opt level: O3

void __thiscall Gillespie::Iterate(Gillespie *this)

{
  undefined8 *puVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer pdVar2;
  int index;
  SpeciesTracker *pSVar3;
  underflow_error *this_01;
  pointer psVar4;
  code *pcVar5;
  undefined *puVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  VecPtr *population;
  double extraout_XMM0_Qa;
  double dVar10;
  double dVar11;
  Ptr local_50;
  long local_40;
  VecPtr *local_38;
  
  if (this->initialized_ == false) {
    Initialize(this);
  }
  if (this->alpha_sum_ <= 0.0) {
    this_01 = (underflow_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              ((runtime_error *)this_01,
               "Gillespie: Propensity of system is 0. No reactions will execute.");
    puVar6 = &std::runtime_error::typeinfo;
    pcVar5 = std::runtime_error::~runtime_error;
LAB_0012ab01:
    __cxa_throw(this_01,puVar6,pcVar5);
  }
  Random::random();
  dVar11 = this->alpha_sum_;
  dVar10 = log(1.0 / extraout_XMM0_Qa);
  dVar10 = dVar10 * (1.0 / dVar11);
  if (0x3fe < (uint)((ulong)((long)ABS(dVar10) + -0x10000000000000) >> 0x35)) {
    this_01 = (underflow_error *)__cxa_allocate_exception(0x10);
    std::underflow_error::underflow_error(this_01,"Underflow error.");
    puVar6 = &std::underflow_error::typeinfo;
    pcVar5 = std::underflow_error::~underflow_error;
    goto LAB_0012ab01;
  }
  this->time_ = dVar10 + this->time_;
  population = &this->reactions_;
  index = Random::WeightedChoiceIndex<std::shared_ptr<Reaction>>(population,&this->alpha_list_);
  lVar7 = (long)index;
  lVar8 = lVar7 * 0x10;
  (**(code **)((long)((this->reactions_).
                      super__Vector_base<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[lVar7].
                      super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                     _vptr_Reaction + 8))();
  psVar4 = (this->reactions_).
           super__Vector_base<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((psVar4[lVar7].super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      tRNA_reaction_ == false) {
    pSVar3 = SpeciesTracker::Instance();
    psVar4 = (population->
             super__Vector_base<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (pSVar3->force_update_all_ != true) {
      local_50.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           psVar4[lVar7].super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_50.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           psVar4[lVar7].super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if (local_50.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_50.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_50.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_50.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_50.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      UpdatePropensity(this,&local_50);
      if (local_50.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_50.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      goto LAB_0012aa37;
    }
  }
  local_40 = lVar8;
  local_38 = population;
  if ((this->reactions_).
      super__Vector_base<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>.
      _M_impl.super__Vector_impl_data._M_finish != psVar4) {
    lVar8 = 8;
    uVar9 = 0;
    do {
      puVar1 = *(undefined8 **)((long)psVar4 + lVar8 + -8);
      this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                 ((long)&(psVar4->super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
                 lVar8);
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      dVar11 = (double)(**(code **)*puVar1)();
      pdVar2 = (this->alpha_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar2[uVar9] = pdVar2[uVar9] + dVar11;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      this->alpha_sum_ = dVar11 + this->alpha_sum_;
      uVar9 = uVar9 + 1;
      psVar4 = (this->reactions_).
               super__Vector_base<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar8 = lVar8 + 0x10;
    } while (uVar9 < (ulong)((long)(this->reactions_).
                                   super__Vector_base<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)psVar4 >> 4));
  }
  pSVar3 = SpeciesTracker::Instance();
  pSVar3->force_update_all_ = false;
  lVar8 = local_40;
  population = local_38;
LAB_0012aa37:
  if (*(char *)(*(long *)((long)&(((population->
                                   super__Vector_base<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->
                                 super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
                         lVar8) + 0x28) == '\x01') {
    DeleteReaction(this,index);
  }
  this->iteration_ = this->iteration_ + 1;
  return;
}

Assistant:

void Gillespie::Iterate() {
  // Make sure propensities have been initialized
  // std::cout << "begin iteration" << std::endl;
  if (initialized_ == false) {
    Initialize();
  }

  // Basic sanity checks
  if (alpha_sum_ <= 0) {
    throw std::runtime_error(
        "Gillespie: Propensity of system is 0. No reactions will execute.");
  }
  double random_num = Random::random();
  // Calculate tau, i.e. time until next reaction
  double tau = (1.0 / alpha_sum_) * std::log(1.0 / random_num);
  if (!std::isnormal(tau)) {
    throw std::underflow_error("Underflow error.");
  }
  time_ += tau;
  // Randomly select next reaction to execute, weighted by propensities
  auto next_reaction = Random::WeightedChoiceIndex(reactions_, alpha_list_);
  reactions_[next_reaction]->Execute();
  // std::cout << std::to_string(alpha_list_[next_reaction]) << std::endl;
  // if (!SpeciesTracker::Instance().codon_map().empty()) {
  if (reactions_[next_reaction]->is_tRNA() || SpeciesTracker::Instance().check_force_update()) {
    for (int i = 0; i < reactions_.size(); i++) {
      double alpha_diff = IndexUpdatePropensity(reactions_[i], i);
      alpha_sum_ += alpha_diff;
    }
    SpeciesTracker::Instance().unflag_force_update();
  } else {
    UpdatePropensity(reactions_[next_reaction]);
  }
  if (reactions_[next_reaction]->remove() == true) {
    // std::cout << std::to_string(alpha_list_[next_reaction]) << std::endl;
    DeleteReaction(next_reaction);
  }
  iteration_++;
}